

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O0

void __thiscall QAbstractScrollArea::QAbstractScrollArea(QAbstractScrollArea *this,QWidget *parent)

{
  long lVar1;
  QAbstractScrollAreaPrivate *this_00;
  QAbstractScrollAreaPrivate *this_01;
  QFramePrivate *in_RSI;
  QFrame *in_RDI;
  long in_FS_OFFSET;
  QAbstractScrollAreaPrivate *d;
  undefined8 in_stack_ffffffffffffffd8;
  QFlagsStorage<Qt::WindowType> f;
  
  f.i = (Int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QAbstractScrollAreaPrivate *)operator_new(0x2f8);
  QAbstractScrollAreaPrivate::QAbstractScrollAreaPrivate(this_00);
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x49744d);
  QFrame::QFrame(in_RDI,in_RSI,(QWidget *)this_00,(WindowFlags)f.i);
  *(undefined ***)&in_RDI->super_QWidget = &PTR_metaObject_00d0b540;
  *(undefined ***)&(in_RDI->super_QWidget).super_QPaintDevice = &PTR__QAbstractScrollArea_00d0b718;
  this_01 = d_func((QAbstractScrollArea *)0x49748a);
  QAbstractScrollAreaPrivate::init(this_01,(EVP_PKEY_CTX *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAbstractScrollArea::QAbstractScrollArea(QWidget *parent)
    :QFrame(*new QAbstractScrollAreaPrivate, parent)
{
    Q_D(QAbstractScrollArea);
    QT_TRY {
        d->init();
    }